

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O3

int Abc_NtkSizeOfGlobalBdds(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  uint *__ptr;
  ulong uVar6;
  DdNode **nodeArray;
  void *pvVar7;
  undefined8 uVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  
  pVVar9 = pNtk->vCos;
  uVar1 = pVVar9->nSize;
  __ptr = (uint *)malloc(0x10);
  uVar6 = 8;
  if (6 < uVar1 - 1) {
    uVar6 = (ulong)uVar1;
  }
  __ptr[1] = 0;
  uVar4 = (uint)uVar6;
  *__ptr = uVar4;
  lVar10 = 0;
  if (uVar4 == 0) {
    nodeArray = (DdNode **)0x0;
  }
  else {
    nodeArray = (DdNode **)malloc((long)(int)uVar4 << 3);
  }
  *(DdNode ***)(__ptr + 2) = nodeArray;
  if (0 < (int)uVar1) {
    lVar13 = 0;
    do {
      lVar10 = *(long *)(*pVVar9->pArray[lVar13] + 0x1b0);
      if (*(int *)(lVar10 + 4) < 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      piVar3 = *(int **)(*(long *)(lVar10 + 8) + 0x38);
      pvVar7 = *(void **)(piVar3 + 2);
      if (pvVar7 == (void *)0x0) {
        __assert_fail("p->pArrayPtr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecAtt.h"
                      ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
      }
      iVar5 = (int)*(long *)((long)pVVar9->pArray[lVar13] + 0x10);
      lVar10 = (long)iVar5;
      iVar2 = *piVar3;
      if (iVar2 <= iVar5) {
        iVar12 = iVar5 + 10;
        if (iVar5 < iVar2 * 2) {
          iVar12 = iVar2 * 2;
        }
        if (iVar2 < iVar12) {
          pvVar7 = realloc(pvVar7,(long)iVar12 * 8);
          *(void **)(piVar3 + 2) = pvVar7;
          memset((void *)((long)pvVar7 + (long)*piVar3 * 8),0,((long)iVar12 - (long)*piVar3) * 8);
          *piVar3 = iVar12;
        }
      }
      lVar11 = *(long *)((long)pvVar7 + lVar10 * 8);
      if (lVar11 == 0) {
        if (*(code **)(piVar3 + 8) == (code *)0x0) {
          lVar11 = 0;
        }
        else {
          uVar8 = (**(code **)(piVar3 + 8))(*(undefined8 *)(piVar3 + 4));
          *(undefined8 *)(*(long *)(piVar3 + 2) + lVar10 * 8) = uVar8;
          lVar11 = *(long *)(*(long *)(piVar3 + 2) + lVar10 * 8);
        }
      }
      iVar5 = (int)uVar6;
      if ((int)lVar13 == iVar5) {
        if (iVar5 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar7 = malloc(0x80);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = 0x10;
          uVar6 = 0x10;
        }
        else {
          uVar6 = (ulong)(uint)(iVar5 * 2);
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar7 = malloc(uVar6 * 8);
          }
          else {
            pvVar7 = realloc(*(void **)(__ptr + 2),uVar6 * 8);
          }
          *(void **)(__ptr + 2) = pvVar7;
          *__ptr = iVar5 * 2;
        }
      }
      else {
        pvVar7 = *(void **)(__ptr + 2);
      }
      lVar10 = lVar13 + 1;
      __ptr[1] = (uint)lVar10;
      *(long *)((long)pvVar7 + lVar13 * 8) = lVar11;
      pVVar9 = pNtk->vCos;
      lVar13 = lVar10;
    } while (lVar10 < pVVar9->nSize);
    nodeArray = *(DdNode ***)(__ptr + 2);
  }
  iVar5 = Cudd_SharingSize(nodeArray,(int)lVar10);
  if (nodeArray != (DdNode **)0x0) {
    free(nodeArray);
  }
  free(__ptr);
  return iVar5;
}

Assistant:

int Abc_NtkSizeOfGlobalBdds( Abc_Ntk_t * pNtk ) 
{
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int RetValue, i;
    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );
    RetValue = Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncsGlob), Vec_PtrSize(vFuncsGlob) );
    Vec_PtrFree( vFuncsGlob );
    return RetValue;
}